

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender-c.cpp
# Opt level: O2

duckdb_state duckdb_appender_destroy(duckdb_appender *appender)

{
  AppenderWrapper *this;
  duckdb_state dVar1;
  
  dVar1 = DuckDBError;
  if ((appender != (duckdb_appender *)0x0) && (*appender != (duckdb_appender)0x0)) {
    dVar1 = duckdb_appender_close(*appender);
    this = (AppenderWrapper *)*appender;
    if (this != (AppenderWrapper *)0x0) {
      duckdb::AppenderWrapper::~AppenderWrapper(this);
      operator_delete(this);
    }
    *appender = (duckdb_appender)0x0;
  }
  return dVar1;
}

Assistant:

duckdb_state duckdb_appender_destroy(duckdb_appender *appender) {
	if (!appender || !*appender) {
		return DuckDBError;
	}
	auto state = duckdb_appender_close(*appender);
	auto wrapper = reinterpret_cast<AppenderWrapper *>(*appender);
	if (wrapper) {
		delete wrapper;
	}
	*appender = nullptr;
	return state;
}